

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::TraceBuffer::WriteChunkRecord
          (TraceBuffer *this,uint8_t *wptr,ChunkRecord *record,uint8_t *src,size_t size)

{
  size_t *psVar1;
  undefined2 uVar2;
  undefined8 uVar3;
  uint8_t *puVar4;
  const_iterator __pos;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  long lVar7;
  tuple<> tStack_21;
  _Head_base<0UL,_const_std::pair<unsigned_short,_unsigned_short>_&,_false> _Stack_20;
  
  puVar4 = (uint8_t *)((this->data_).p_ + this->size_);
  if ((ulong)((long)puVar4 - (long)this->wptr_) < (ulong)record->size) {
    _Stack_20._M_head_impl = (pair<unsigned_short,_unsigned_short> *)0x315fb5;
    WriteChunkRecord();
  }
  else if (wptr + size + 0x10 <= puVar4) {
    uVar3 = *(undefined8 *)&record->num_fragments;
    *(undefined8 *)wptr = *(undefined8 *)record;
    *(undefined8 *)(wptr + 8) = uVar3;
    if (src != (uint8_t *)0x0) {
      _Stack_20._M_head_impl = (pair<unsigned_short,_unsigned_short> *)0x315f95;
      memcpy(wptr + 0x10,src,size);
    }
    memset(wptr + size + 0x10,0,(record->size - size) - 0x10);
    return;
  }
  _Stack_20._M_head_impl =
       (pair<unsigned_short,_unsigned_short> *)
       std::
       map<std::pair<unsigned_short,_unsigned_short>,_unsigned_int,_std::less<std::pair<unsigned_short,_unsigned_short>_>,_std::allocator<std::pair<const_std::pair<unsigned_short,_unsigned_short>,_unsigned_int>_>_>
       ::operator[];
  WriteChunkRecord();
  p_Var5 = (_Base_ptr)this->size_;
  psVar1 = &(this->data_).size_;
  __pos._M_node = (_Base_ptr)psVar1;
  if (p_Var5 != (_Base_ptr)0x0) {
    p_Var6 = (_Base_ptr)psVar1;
    do {
      uVar2 = (undefined2)p_Var5[1]._M_color;
      if (((ushort)uVar2 < ((pair<unsigned_short,_unsigned_short> *)wptr)->first) ||
         ((lVar7 = 0x10, __pos._M_node = p_Var5,
          (ushort)uVar2 <= ((pair<unsigned_short,_unsigned_short> *)wptr)->first &&
          ((ushort)*(undefined2 *)((long)&p_Var5[1]._M_color + 2) <
           ((pair<unsigned_short,_unsigned_short> *)wptr)->second)))) {
        lVar7 = 0x18;
        __pos._M_node = p_Var6;
      }
      p_Var5 = *(_Base_ptr *)((long)&p_Var5->_M_color + lVar7);
      p_Var6 = __pos._M_node;
    } while (p_Var5 != (_Base_ptr)0x0);
  }
  if (__pos._M_node != (_Base_ptr)psVar1) {
    uVar2 = (undefined2)__pos._M_node[1]._M_color;
    if ((ushort)uVar2 <= ((pair<unsigned_short,_unsigned_short> *)wptr)->first) {
      if ((ushort)uVar2 < ((pair<unsigned_short,_unsigned_short> *)wptr)->first) {
        return;
      }
      if ((ushort)*(undefined2 *)((long)&__pos._M_node[1]._M_color + 2) <=
          ((pair<unsigned_short,_unsigned_short> *)wptr)->second) {
        return;
      }
    }
  }
  _Stack_20._M_head_impl = (pair<unsigned_short,_unsigned_short> *)wptr;
  ::std::
  _Rb_tree<std::pair<unsigned_short,unsigned_short>,std::pair<std::pair<unsigned_short,unsigned_short>const,unsigned_int>,std::_Select1st<std::pair<std::pair<unsigned_short,unsigned_short>const,unsigned_int>>,std::less<std::pair<unsigned_short,unsigned_short>>,std::allocator<std::pair<std::pair<unsigned_short,unsigned_short>const,unsigned_int>>>
  ::
  _M_emplace_hint_unique<std::piecewise_construct_t_const&,std::tuple<std::pair<unsigned_short,unsigned_short>const&>,std::tuple<>>
            ((_Rb_tree<std::pair<unsigned_short,unsigned_short>,std::pair<std::pair<unsigned_short,unsigned_short>const,unsigned_int>,std::_Select1st<std::pair<std::pair<unsigned_short,unsigned_short>const,unsigned_int>>,std::less<std::pair<unsigned_short,unsigned_short>>,std::allocator<std::pair<std::pair<unsigned_short,unsigned_short>const,unsigned_int>>>
              *)this,__pos,(piecewise_construct_t *)&::std::piecewise_construct,
             (tuple<const_std::pair<unsigned_short,_unsigned_short>_&> *)&_Stack_20,&tStack_21);
  return;
}

Assistant:

void WriteChunkRecord(uint8_t* wptr,
                        const ChunkRecord& record,
                        const uint8_t* src,
                        size_t size) {
    // Note: |record.size| will be slightly bigger than |size| because of the
    // ChunkRecord header and rounding, to ensure that all ChunkRecord(s) are
    // multiple of sizeof(ChunkRecord). The invariant is:
    // record.size >= |size| + sizeof(ChunkRecord) (== if no rounding).
    PERFETTO_DCHECK(size <= ChunkRecord::kMaxSize);
    PERFETTO_DCHECK(record.size >= sizeof(record));
    PERFETTO_DCHECK(record.size % sizeof(record) == 0);
    PERFETTO_DCHECK(record.size >= size + sizeof(record));
    PERFETTO_CHECK(record.size <= size_to_end());
    DcheckIsAlignedAndWithinBounds(wptr);

    // We may be writing to this area for the first time.
    data_.EnsureCommitted(static_cast<size_t>(wptr + record.size - begin()));

    // Deliberately not a *D*CHECK.
    PERFETTO_CHECK(wptr + sizeof(record) + size <= end());
    memcpy(wptr, &record, sizeof(record));
    if (PERFETTO_LIKELY(src)) {
      // If the producer modifies the data in the shared memory buffer while we
      // are copying it to the central buffer, TSAN will (rightfully) flag that
      // as a race. However the entire purpose of copying the data into the
      // central buffer is that we can validate it without worrying that the
      // producer changes it from under our feet, so this race is benign. The
      // alternative would be to try computing which part of the buffer is safe
      // to read (assuming a well-behaving client), but the risk of introducing
      // a bug that way outweighs the benefit.
      PERFETTO_ANNOTATE_BENIGN_RACE_SIZED(
          src, size, "Benign race when copying chunk from shared memory.")
      memcpy(wptr + sizeof(record), src, size);
    } else {
      PERFETTO_DCHECK(size == record.size - sizeof(record));
    }
    const size_t rounding_size = record.size - sizeof(record) - size;
    memset(wptr + sizeof(record) + size, 0, rounding_size);
  }